

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parity.c
# Opt level: O0

int main(int argc,char **argv)

{
  int iVar1;
  int iVar2;
  int fd2_00;
  size_t sVar3;
  void *buf;
  char *buff;
  size_t msgSize;
  char *msg1;
  char *msg0;
  int fd2;
  int fd1;
  int fd0;
  char **argv_local;
  int argc_local;
  
  iVar1 = open("f0",0x242,0x1b6);
  iVar2 = open("f1",0x242,0x1b6);
  fd2_00 = open("f2",0x242,0x1b6);
  sVar3 = strlen("hello world\n");
  parityWrite(iVar1,iVar2,fd2_00,"hello world\n","testing 123\n",sVar3 + 1);
  close(iVar1);
  close(iVar2);
  close(fd2_00);
  unlink("f1");
  iVar1 = open("f0",2,0x1b6);
  iVar2 = open("f2",2,0x1b6);
  sVar3 = strlen("hello world\n");
  buf = malloc(sVar3 + 1);
  parityRead(iVar1,iVar2,buf,sVar3 + 1);
  printf("f1 contents are = %s\n",buf);
  close(iVar1);
  close(iVar2);
  free(buf);
  unlink("f0");
  unlink("f2");
  return 0;
}

Assistant:

int main(int argc, char** argv)
{
    int fd0 = open("f0", O_CREAT|O_TRUNC|O_RDWR, 0666);
    int fd1 = open("f1", O_CREAT|O_TRUNC|O_RDWR, 0666);
    int fd2 = open("f2", O_CREAT|O_TRUNC|O_RDWR, 0666);

    const char* msg0 = "hello world\n";
    const char* msg1 = "testing 123\n";

    parityWrite(fd0,fd1,fd2,msg0,msg1,strlen(msg0)+1);

    close(fd0);
    close(fd1);
    close(fd2);

    unlink("f1");

    fd0 = open("f0", O_RDWR, 0666);
    fd2 = open("f2", O_RDWR, 0666);

    size_t msgSize = sizeof(char)*strlen(msg0)+1;
    char *buff = (char*)malloc(msgSize);

    parityRead(fd0, fd2, buff, msgSize);

    printf("f1 contents are = %s\n", buff);

    close(fd0);
    close(fd2);

    free(buff);

    unlink("f0");
    unlink("f2");

    return 0;
}